

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O1

uint8_t matrix4_transformation_decompose_EXP
                  (matrix4 *self,vector3 *scale,quaternion *rotation,vector3 *translation)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  
  (translation->field_0).v[0] = (self->field_0).m[3];
  (translation->field_0).v[1] = (self->field_0).m[7];
  (translation->field_0).v[2] = (self->field_0).m[0xb];
  dVar14 = (self->field_0).m[4];
  dVar1 = (self->field_0).m[0];
  dVar2 = (self->field_0).m[1];
  dVar3 = (self->field_0).m[8];
  dVar4 = (self->field_0).m[0xc];
  dVar5 = (self->field_0).m[5];
  dVar6 = (self->field_0).m[9];
  dVar7 = (self->field_0).m[0xd];
  dVar8 = (self->field_0).m[2];
  dVar9 = (self->field_0).m[6];
  dVar10 = (self->field_0).m[10];
  dVar11 = (self->field_0).m[0xe];
  dVar13 = dVar3 * dVar3 + dVar1 * dVar1 + dVar14 * dVar14;
  if (dVar13 < 0.0) {
    dVar13 = sqrt(dVar13);
  }
  else {
    dVar13 = SQRT(dVar13);
  }
  uVar12 = -(ulong)(dVar1 * dVar14 * dVar3 * dVar4 < 0.0);
  (scale->field_0).v[0] = (double)(~uVar12 & (ulong)dVar13 | (ulong)-dVar13 & uVar12);
  dVar14 = (self->field_0).m[9] * (self->field_0).m[9] +
           (self->field_0).m[1] * (self->field_0).m[1] + (self->field_0).m[5] * (self->field_0).m[5]
  ;
  if (dVar14 < 0.0) {
    dVar14 = sqrt(dVar14);
  }
  else {
    dVar14 = SQRT(dVar14);
  }
  uVar12 = -(ulong)(dVar2 * dVar5 * dVar6 * dVar7 < 0.0);
  (scale->field_0).v[1] = (double)(~uVar12 & (ulong)dVar14 | (ulong)-dVar14 & uVar12);
  dVar14 = (self->field_0).m[10] * (self->field_0).m[10] +
           (self->field_0).m[2] * (self->field_0).m[2] + (self->field_0).m[6] * (self->field_0).m[6]
  ;
  if (dVar14 < 0.0) {
    dVar14 = sqrt(dVar14);
  }
  else {
    dVar14 = SQRT(dVar14);
  }
  uVar12 = -(ulong)(dVar8 * dVar9 * dVar10 * dVar11 < 0.0);
  (scale->field_0).v[2] = (double)(~uVar12 & (ulong)dVar14 | (ulong)-dVar14 & uVar12);
  (rotation->field_0).q[0] = 0.0;
  (rotation->field_0).q[1] = 0.0;
  (rotation->field_0).q[2] = 0.0;
  (rotation->field_0).q[3] = 1.0;
  return '\x01';
}

Assistant:

HYPAPI uint8_t matrix4_transformation_decompose_EXP(struct matrix4 *self, struct vector3 *scale, struct quaternion *rotation, struct vector3 *translation)
{
	HYP_FLOAT signx, signy, signz;

	/* translation */
	translation->x = self->c30;
	translation->y = self->c31;
	translation->z = self->c32;

	/*
	 * self->c00 = scale->x;
	 * self->c11 = scale->y;
	 * self->c22 = scale->z;
	 */

	/* sign */
	signx = ((self->c00 * self->c01 * self->c02 * self->c03) < 0) ? -1.0f : 1.0f;
	signy = ((self->c10 * self->c11 * self->c12 * self->c13) < 0) ? -1.0f : 1.0f;
	signz = ((self->c20 * self->c21 * self->c22 * self->c23) < 0) ? -1.0f : 1.0f;

	/* scale */
	scale->x = signx * HYP_SQRT(self->c00 * self->c00 + self->c01 * self->c01 + self->c02 * self->c02);
	scale->y = signy * HYP_SQRT(self->c10 * self->c10 + self->c11 * self->c11 + self->c12 * self->c12);
	scale->z = signz * HYP_SQRT(self->c20 * self->c20 + self->c21 * self->c21 + self->c22 * self->c22);

	/* todo */
	quaternion_identity(rotation);

	return 1;
}